

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streambuf.h
# Opt level: O3

int __thiscall
Fixpp::
StreamBufBase<Fixpp::VersionnedMessage<Fixpp::v42::Version,_Fixpp::Chars<'A'>,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>,_1024UL>
::digitsCount(StreamBufBase<Fixpp::VersionnedMessage<Fixpp::v42::Version,_Fixpp::Chars<_A_>,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>,_1024UL>
              *this,size_t x)

{
  int iVar1;
  
  iVar1 = 1;
  if (((((9 < x) && (iVar1 = 2, 99 < x)) && (iVar1 = 3, 999 < x)) &&
      ((iVar1 = 4, 9999 < x && (iVar1 = 5, 99999 < x)))) &&
     ((iVar1 = 6, 999999 < x && ((iVar1 = 7, 9999999 < x && (iVar1 = 8, 99999999 < x)))))) {
    iVar1 = 10 - (uint)(x < 1000000000);
  }
  return iVar1;
}

Assistant:

int digitsCount(size_t x)
        {  
            return (x < 10 ? 1 :   
                (x < 100 ? 2 :   
                (x < 1000 ? 3 :   
                (x < 10000 ? 4 :   
                (x < 100000 ? 5 :   
                (x < 1000000 ? 6 :   
                (x < 10000000 ? 7 :  
                (x < 100000000 ? 8 :  
                (x < 1000000000 ? 9 :  
                10)))))))));  
        }